

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5PutVarint64(uchar *p,u64 v)

{
  undefined4 uVar1;
  byte local_36 [8];
  u8 buf [10];
  int n;
  int j;
  int i;
  u64 v_local;
  uchar *p_local;
  
  if ((v & 0xff00000000000000) == 0) {
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    _j = v;
    do {
      uVar1 = buf._2_4_;
      buf._2_4_ = buf._2_4_ + 1;
      local_36[(int)uVar1] = (byte)_j & 0x7f | 0x80;
      _j = _j >> 7;
    } while (_j != 0);
    local_36[0] = local_36[0] & 0x7f;
    n = 0;
    for (buf._6_4_ = buf._2_4_ + -1; -1 < (int)buf._6_4_; buf._6_4_ = buf._6_4_ + -1) {
      p[n] = local_36[(int)buf._6_4_];
      n = n + 1;
    }
    p_local._4_1_ = buf[2];
    p_local._5_1_ = buf[3];
    p_local._6_1_ = buf[4];
    p_local._7_1_ = buf[5];
  }
  else {
    p[8] = (uchar)v;
    _j = v >> 8;
    for (n = 7; -1 < n; n = n + -1) {
      p[n] = (byte)_j & 0x7f | 0x80;
      _j = _j >> 7;
    }
    p_local._4_4_ = 9;
  }
  return p_local._4_4_;
}

Assistant:

static int FTS5_NOINLINE fts5PutVarint64(unsigned char *p, u64 v){
  int i, j, n;
  u8 buf[10];
  if( v & (((u64)0xff000000)<<32) ){
    p[8] = (u8)v;
    v >>= 8;
    for(i=7; i>=0; i--){
      p[i] = (u8)((v & 0x7f) | 0x80);
      v >>= 7;
    }
    return 9;
  }    
  n = 0;
  do{
    buf[n++] = (u8)((v & 0x7f) | 0x80);
    v >>= 7;
  }while( v!=0 );
  buf[0] &= 0x7f;
  assert( n<=9 );
  for(i=0, j=n-1; j>=0; j--, i++){
    p[i] = buf[j];
  }
  return n;
}